

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O1

int __thiscall
TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>::
ClassId(TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
        *this)

{
  uint uVar1;
  int iVar2;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"TPZSkylineNSymStructMatrix","");
  uVar1 = Hash(&local_40);
  iVar2 = TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
          ::ClassId(&this->
                     super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                   );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZSkylineNSymStructMatrix<TVar,TPar>::ClassId() const{
  return Hash("TPZSkylineNSymStructMatrix") ^
    TPZSkylineStructMatrix<TVar,TPar>::ClassId() << 1;
}